

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_gui.cpp
# Opt level: O2

qreal QtGuiTest::scaleFactor(QWindow *window)

{
  qreal qVar1;
  QDebug *pQVar2;
  long in_FS_OFFSET;
  QDebug local_40;
  Stream *local_38;
  undefined1 local_30 [8];
  _func_int **local_28;
  
  local_28 = *(_func_int ***)(in_FS_OFFSET + 0x28);
  lcQtGuiTest();
  if (((byte)lcQtGuiTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    QMessageLogger::debug();
    pQVar2 = QDebug::operator<<(&local_40,"Calculating scaling factor: ");
    local_38 = pQVar2->stream;
    local_38->ref = local_38->ref + 1;
    ::operator<<((Stream *)local_30,(QWindow *)&local_38);
    QDebug::~QDebug((QDebug *)local_30);
    QDebug::~QDebug((QDebug *)&local_38);
    QDebug::~QDebug(&local_40);
  }
  qVar1 = QHighDpiScaling::factor<QWindow_const>(window);
  if (*(_func_int ***)(in_FS_OFFSET + 0x28) == local_28) {
    return qVar1;
  }
  __stack_chk_fail();
}

Assistant:

qreal QtGuiTest::scaleFactor(const QWindow *window)
{
    Q_ASSERT_X(window,
               Q_FUNC_INFO,
               "called with nullptr");

    deb << "Calculating scaling factor: " << window;
    return QHighDpiScaling::factor(window);
}